

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int compound_skip_by_single_states
              (AV1_COMP *cpi,InterModeSearchState *search_state,PREDICTION_MODE this_mode,
              MV_REFERENCE_FRAME ref_frame,MV_REFERENCE_FRAME second_ref_frame,MACROBLOCK *x)

{
  byte bVar1;
  int iVar2;
  char in_CL;
  PREDICTION_MODE in_DL;
  InterModeSearchState *in_RSI;
  AV1_COMP *in_RDI;
  char in_R8B;
  int match;
  MV_REFERENCE_FRAME *ref_order;
  int candidates;
  int_mv comp_mv;
  int_mv single_mv;
  int ref_mv_idx;
  MV_REFERENCE_FRAME single_refs [2];
  int ref_set;
  int state_cnt;
  SingleInterModeState *state;
  int j;
  int i;
  int ref_mv_match [2];
  int ref_searched [2];
  int mode_dir [2];
  int mode_offset [2];
  int mode [2];
  MV_REFERENCE_FRAME refs [2];
  MV_REFERENCE_FRAME *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  bool bVar3;
  int in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int local_80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_5c;
  int local_58;
  int local_4c [4];
  int local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  char local_2a [17];
  PREDICTION_MODE local_19;
  InterModeSearchState *local_18;
  AV1_COMP *local_10;
  
  local_2a[0] = in_CL;
  local_2a[1] = in_R8B;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = compound_ref0_mode(in_DL);
  local_34 = (uint)bVar1;
  bVar1 = compound_ref1_mode(local_19);
  local_30 = (uint)bVar1;
  local_3c = local_34 - 0xd;
  local_38 = local_30 - 0xd;
  local_4c[2] = (int)('\x04' < local_2a[0]);
  local_4c[3] = (int)('\x04' < local_2a[1]);
  memset(local_4c,0,8);
  for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
    in_stack_ffffffffffffff94 =
         local_18->single_state_cnt[local_4c[(long)local_58 + 2]][local_4c[(long)local_58 + 4]];
    for (local_5c = 0; local_5c < in_stack_ffffffffffffff94; local_5c = local_5c + 1) {
      if (local_18->single_state[local_4c[(long)local_58 + 2]][local_4c[(long)local_58 + 4]]
          [local_5c].ref_frame == local_2a[local_58]) {
        local_4c[local_58] = 1;
        break;
      }
    }
  }
  iVar2 = get_drl_refmv_count((MACROBLOCK *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              (MV_REFERENCE_FRAME *)
                              CONCAT17(in_stack_ffffffffffffff8f,
                                       CONCAT16(in_stack_ffffffffffffff8e,
                                                CONCAT24(in_stack_ffffffffffffff8c,
                                                         in_stack_ffffffffffffff88))),
                              (PREDICTION_MODE)((uint)in_stack_ffffffffffffff84 >> 0x18));
  for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
    if ((local_4c[local_58] != 0) &&
       ((local_4c[(long)local_58 + 6] == 0xd || (local_4c[(long)local_58 + 6] == 0xe)))) {
      for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        get_this_mv((int_mv *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (PREDICTION_MODE)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                    (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                    in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    (MB_MODE_INFO_EXT *)CONCAT44(in_stack_ffffffffffffff94,iVar2));
        get_this_mv((int_mv *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (PREDICTION_MODE)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                    (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                    in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    (MB_MODE_INFO_EXT *)CONCAT44(in_stack_ffffffffffffff94,iVar2));
        if (in_stack_ffffffffffffff84 != local_80) {
          local_4c[(long)local_58 + -2] = 0;
          break;
        }
      }
    }
  }
  local_58 = 0;
  do {
    if (1 < local_58) {
      return 0;
    }
    if ((local_4c[local_58] != 0) && (local_4c[(long)local_58 + -2] != 0)) {
      iVar2 = compound_skip_get_candidates
                        (local_10,local_18,local_4c[(long)local_58 + 2],
                         (PREDICTION_MODE)local_4c[(long)local_58 + 6]);
      bVar3 = false;
      for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
        if (local_2a[local_58] ==
            local_18->single_rd_order[local_4c[(long)local_58 + 2]][local_4c[(long)local_58 + 4]]
            [local_5c]) {
          bVar3 = true;
          break;
        }
      }
      if (!bVar3) {
        return 1;
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

static int compound_skip_by_single_states(
    const AV1_COMP *cpi, const InterModeSearchState *search_state,
    const PREDICTION_MODE this_mode, const MV_REFERENCE_FRAME ref_frame,
    const MV_REFERENCE_FRAME second_ref_frame, const MACROBLOCK *x) {
  const MV_REFERENCE_FRAME refs[2] = { ref_frame, second_ref_frame };
  const int mode[2] = { compound_ref0_mode(this_mode),
                        compound_ref1_mode(this_mode) };
  const int mode_offset[2] = { INTER_OFFSET(mode[0]), INTER_OFFSET(mode[1]) };
  const int mode_dir[2] = { refs[0] <= GOLDEN_FRAME ? 0 : 1,
                            refs[1] <= GOLDEN_FRAME ? 0 : 1 };
  int ref_searched[2] = { 0, 0 };
  int ref_mv_match[2] = { 1, 1 };
  int i, j;

  for (i = 0; i < 2; ++i) {
    const SingleInterModeState *state =
        search_state->single_state[mode_dir[i]][mode_offset[i]];
    const int state_cnt =
        search_state->single_state_cnt[mode_dir[i]][mode_offset[i]];
    for (j = 0; j < state_cnt; ++j) {
      if (state[j].ref_frame == refs[i]) {
        ref_searched[i] = 1;
        break;
      }
    }
  }

  const int ref_set = get_drl_refmv_count(x, refs, this_mode);
  for (i = 0; i < 2; ++i) {
    if (!ref_searched[i] || (mode[i] != NEARESTMV && mode[i] != NEARMV)) {
      continue;
    }
    const MV_REFERENCE_FRAME single_refs[2] = { refs[i], NONE_FRAME };
    for (int ref_mv_idx = 0; ref_mv_idx < ref_set; ref_mv_idx++) {
      int_mv single_mv;
      int_mv comp_mv;
      get_this_mv(&single_mv, mode[i], 0, ref_mv_idx, 0, single_refs,
                  &x->mbmi_ext);
      get_this_mv(&comp_mv, this_mode, i, ref_mv_idx, 0, refs, &x->mbmi_ext);
      if (single_mv.as_int != comp_mv.as_int) {
        ref_mv_match[i] = 0;
        break;
      }
    }
  }

  for (i = 0; i < 2; ++i) {
    if (!ref_searched[i] || !ref_mv_match[i]) continue;
    const int candidates =
        compound_skip_get_candidates(cpi, search_state, mode_dir[i], mode[i]);
    const MV_REFERENCE_FRAME *ref_order =
        search_state->single_rd_order[mode_dir[i]][mode_offset[i]];
    int match = 0;
    for (j = 0; j < candidates; ++j) {
      if (refs[i] == ref_order[j]) {
        match = 1;
        break;
      }
    }
    if (!match) return 1;
  }

  return 0;
}